

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O0

void emit_wrong_version(Dwarf_Debug dbg,Dwarf_Half version,Dwarf_Error *error)

{
  undefined8 error_00;
  char *msg;
  undefined1 local_40 [8];
  dwarfstring m;
  Dwarf_Error *error_local;
  Dwarf_Half version_local;
  Dwarf_Debug dbg_local;
  
  m._24_8_ = error;
  dwarfstring_constructor((dwarfstring_s *)local_40);
  dwarfstring_append_printf_u
            ((dwarfstring *)local_40,
             "DW_DLE_STR_OFFSETS_VERSION_WRONG: %u. Only version 5 is supported when reading .debug_str_offsets. Perhaps the section is a GNU DWARF4 extension with a different format."
             ,(ulong)version);
  error_00 = m._24_8_;
  msg = dwarfstring_string((dwarfstring_s *)local_40);
  _dwarf_error_string(dbg,(Dwarf_Error *)error_00,0x196,msg);
  dwarfstring_destructor((dwarfstring_s *)local_40);
  return;
}

Assistant:

static void
emit_wrong_version(Dwarf_Debug dbg,
    Dwarf_Half version,
    Dwarf_Error *error)
{
    dwarfstring m;

    dwarfstring_constructor(&m);
    dwarfstring_append_printf_u(&m,
        "DW_DLE_STR_OFFSETS_VERSION_WRONG: "
        "%u. Only version 5 is supported "
        "when reading .debug_str_offsets."
        " Perhaps the section is a GNU DWARF4"
        " extension with a different format.",
        version);
    _dwarf_error_string(dbg,error,
        DW_DLE_STR_OFFSETS_VERSION_WRONG,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}